

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O3

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  uint32_t uVar1;
  char *pcVar2;
  long *plVar3;
  U32 *hashTable;
  uint uVar4;
  int iVar5;
  
  if (((LZ4_dict->internal_donotuse).initCheck != 0) ||
     (uVar4 = (LZ4_dict->internal_donotuse).currentOffset, 0x40000000 < uVar4)) {
    uVar4 = 0;
    memset(LZ4_dict,0,0x4020);
  }
  if (dictSize < 8) {
    LZ4_dict->table[0x801] = 0;
    (LZ4_dict->internal_donotuse).dictSize = 0;
    uVar1 = 0;
  }
  else {
    pcVar2 = dictionary + dictSize;
    plVar3 = (long *)(pcVar2 + -0x10000);
    if ((uint)dictSize < 0x10001) {
      plVar3 = (long *)dictionary;
    }
    LZ4_dict->table[0x801] = (unsigned_long_long)plVar3;
    uVar1 = (int)pcVar2 - (int)plVar3;
    (LZ4_dict->internal_donotuse).dictSize = uVar1;
    (LZ4_dict->internal_donotuse).currentOffset = uVar4 + uVar1 + 0x10000;
    if (plVar3 <= pcVar2 + -8) {
      iVar5 = uVar4 + 0x10000;
      do {
        *(int *)((long)LZ4_dict + ((ulong)(*plVar3 * -0x30e4432345000000) >> 0x34) * 4) = iVar5;
        plVar3 = (long *)((long)plVar3 + 3);
        iVar5 = iVar5 + 3;
      } while (plVar3 <= pcVar2 + -8);
    }
  }
  return uVar1;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = &LZ4_dict->internal_donotuse;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    if ((dict->initCheck) || (dict->currentOffset > 1 GB))  /* Uninitialized structure, or reuse overflow */
        LZ4_resetStream(LZ4_dict);

    if (dictSize < (int)HASH_UNIT) {
        dict->dictionary = NULL;
        dict->dictSize = 0;
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    dict->currentOffset += 64 KB;
    base = p - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->currentOffset += dict->dictSize;

    while (p <= dictEnd-HASH_UNIT) {
        LZ4_putPosition(p, dict->hashTable, byU32, base);
        p+=3;
    }

    return dict->dictSize;
}